

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O3

void test_bson_iter_utf8(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  bson_t *pbVar6;
  long lVar7;
  bson_t *pbVar8;
  undefined4 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined8 *puVar12;
  bson_t *pbVar13;
  bson_t *pbVar14;
  bson_t *pbVar15;
  TestSuite *suite;
  ulong uVar16;
  char *unaff_R14;
  undefined1 *puVar17;
  char *unaff_R15;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint32_t len;
  bson_iter_t iter;
  undefined1 auStack_3498 [4104];
  bson_t *pbStack_2490;
  code *pcStack_2488;
  undefined8 uStack_2410;
  undefined1 uStack_2408;
  TestSuite aTStack_2400 [5];
  code *pcStack_2308;
  int *piStack_2290;
  int iStack_2288;
  undefined1 auStack_2284 [4];
  undefined1 auStack_2280 [232];
  bson_t *pbStack_2198;
  undefined1 *puStack_2190;
  code *pcStack_2188;
  bson_t bStack_2180;
  bson_t abStack_2100 [2];
  undefined8 uStack_1fc8;
  char *pcStack_1fc0;
  bson_t *pbStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  bson_t *pbStack_1fa0;
  char *pcStack_1f98;
  char *pcStack_1f90;
  code *pcStack_1f88;
  undefined1 auStack_1f80 [128];
  undefined1 auStack_1f00 [232];
  undefined1 *puStack_1e18;
  undefined1 *puStack_1e10;
  code *pcStack_1e08;
  undefined1 auStack_1e00 [128];
  undefined1 auStack_1d80 [368];
  undefined1 *puStack_1c10;
  code *pcStack_1c08;
  undefined1 auStack_1c00 [128];
  undefined1 auStack_1b80 [128];
  undefined1 auStack_1b00 [128];
  undefined1 auStack_1a80 [368];
  undefined8 *puStack_1910;
  code *apcStack_1908 [13];
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined1 auStack_1890 [16];
  undefined8 auStack_1880 [14];
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined1 auStack_1800 [360];
  undefined1 *puStack_1698;
  undefined1 *puStack_1690;
  code *pcStack_1688;
  undefined1 auStack_1680 [128];
  undefined1 auStack_1600 [368];
  undefined1 *puStack_1490;
  code *pcStack_1488;
  undefined1 auStack_1480 [128];
  undefined1 auStack_1400 [368];
  undefined1 *puStack_1290;
  code *pcStack_1288;
  undefined1 auStack_1280 [128];
  undefined1 auStack_1200 [368];
  undefined1 *puStack_1090;
  code *pcStack_1088;
  undefined1 auStack_1080 [128];
  undefined1 auStack_1000 [368];
  undefined1 *puStack_e90;
  code *pcStack_e88;
  undefined1 auStack_e80 [128];
  undefined1 auStack_e00 [368];
  undefined1 *puStack_c90;
  code *pcStack_c88;
  undefined1 auStack_c80 [128];
  undefined1 auStack_c00 [368];
  undefined8 uStack_a90;
  code *pcStack_a88;
  undefined1 auStack_a80 [224];
  undefined8 uStack_9a0;
  undefined1 *puStack_998;
  undefined8 uStack_990;
  code *pcStack_988;
  undefined1 auStack_980 [240];
  undefined1 *puStack_890;
  code *apcStack_888 [15];
  uint uStack_80c;
  uint *puStack_808;
  undefined1 auStack_800 [8];
  uint uStack_7f8;
  int iStack_7f4;
  uint uStack_7d8;
  bson_t *pbStack_6b0;
  code *pcStack_688;
  undefined1 auStack_680 [240];
  bson_t *pbStack_590;
  code *apcStack_588 [15];
  long lStack_510;
  long lStack_508;
  undefined1 auStack_500 [232];
  bson_t *pbStack_418;
  undefined8 uStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [240];
  bson_t *pbStack_310;
  code *pcStack_308;
  undefined1 auStack_300 [184];
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined1 auStack_238 [152];
  undefined8 uStack_1a0;
  char *pcStack_198;
  char *pcStack_190;
  code *apcStack_188 [16];
  int local_104;
  undefined1 local_100 [224];
  
  local_104 = 0;
  apcStack_188[0] = (code *)0x12a445;
  uVar4 = bson_new();
  apcStack_188[0] = (code *)0x12a469;
  cVar1 = bson_append_utf8(uVar4,"foo",0xffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    apcStack_188[0] = (code *)0x12a604;
    test_bson_iter_utf8_cold_1();
LAB_0012a604:
    apcStack_188[0] = (code *)0x12a609;
    test_bson_iter_utf8_cold_2();
LAB_0012a609:
    apcStack_188[0] = (code *)0x12a60e;
    test_bson_iter_utf8_cold_3();
LAB_0012a60e:
    apcStack_188[0] = (code *)0x12a613;
    test_bson_iter_utf8_cold_4();
LAB_0012a613:
    apcStack_188[0] = (code *)0x12a618;
    test_bson_iter_utf8_cold_5();
LAB_0012a618:
    apcStack_188[0] = (code *)0x12a61d;
    test_bson_iter_utf8_cold_6();
LAB_0012a61d:
    apcStack_188[0] = (code *)0x12a622;
    test_bson_iter_utf8_cold_7();
LAB_0012a622:
    apcStack_188[0] = (code *)0x12a627;
    test_bson_iter_utf8_cold_10();
LAB_0012a627:
    apcStack_188[0] = (code *)0x12a62c;
    test_bson_iter_utf8_cold_11();
LAB_0012a62c:
    apcStack_188[0] = (code *)0x12a631;
    test_bson_iter_utf8_cold_12();
LAB_0012a631:
    apcStack_188[0] = (code *)0x12a636;
    test_bson_iter_utf8_cold_13();
LAB_0012a636:
    apcStack_188[0] = (code *)0x12a63b;
    test_bson_iter_utf8_cold_14();
LAB_0012a63b:
    apcStack_188[0] = (code *)0x12a640;
    test_bson_iter_utf8_cold_9();
  }
  else {
    apcStack_188[0] = (code *)0x12a492;
    cVar1 = bson_append_utf8(uVar4,"bar",0xffffffff,"baz",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012a604;
    apcStack_188[0] = (code *)0x12a4aa;
    cVar1 = bson_iter_init(local_100,uVar4);
    if (cVar1 == '\0') goto LAB_0012a609;
    apcStack_188[0] = (code *)0x12a4bf;
    cVar1 = bson_iter_next(local_100);
    if (cVar1 == '\0') goto LAB_0012a60e;
    apcStack_188[0] = (code *)0x12a4d4;
    iVar2 = bson_iter_type(local_100);
    if (iVar2 != 2) goto LAB_0012a613;
    apcStack_188[0] = (code *)0x12a4ea;
    pcVar5 = (char *)bson_iter_key(local_100);
    apcStack_188[0] = (code *)0x12a4f9;
    iVar2 = strcmp(pcVar5,"foo");
    if (iVar2 != 0) goto LAB_0012a618;
    apcStack_188[0] = (code *)0x12a510;
    pcVar5 = (char *)bson_iter_utf8(local_100,0);
    unaff_R15 = "bar";
    apcStack_188[0] = (code *)0x12a522;
    iVar2 = strcmp(pcVar5,"bar");
    if (iVar2 != 0) goto LAB_0012a61d;
    apcStack_188[0] = (code *)0x12a53c;
    unaff_R14 = (char *)bson_iter_dup_utf8(local_100,&local_104);
    if (unaff_R14 == "bar") {
LAB_0012a55b:
      if (local_104 == 3) {
        apcStack_188[0] = (code *)0x12a56e;
        bson_free(unaff_R14);
        apcStack_188[0] = (code *)0x12a57b;
        cVar1 = bson_iter_next(local_100);
        if (cVar1 == '\0') goto LAB_0012a622;
        apcStack_188[0] = (code *)0x12a590;
        iVar2 = bson_iter_type(local_100);
        if (iVar2 != 2) goto LAB_0012a627;
        apcStack_188[0] = (code *)0x12a5a6;
        pcVar5 = (char *)bson_iter_key(local_100);
        apcStack_188[0] = (code *)0x12a5b5;
        iVar2 = strcmp(pcVar5,"bar");
        if (iVar2 != 0) goto LAB_0012a62c;
        apcStack_188[0] = (code *)0x12a5c8;
        pcVar5 = (char *)bson_iter_utf8(local_100,0);
        apcStack_188[0] = (code *)0x12a5d7;
        iVar2 = strcmp(pcVar5,"baz");
        if (iVar2 != 0) goto LAB_0012a631;
        apcStack_188[0] = (code *)0x12a5e8;
        cVar1 = bson_iter_next(local_100);
        if (cVar1 == '\0') {
          apcStack_188[0] = (code *)0x12a5f4;
          bson_destroy(uVar4);
          return;
        }
        goto LAB_0012a636;
      }
      goto LAB_0012a63b;
    }
    apcStack_188[0] = (code *)0x12a553;
    iVar2 = strcmp("bar",unaff_R14);
    if (iVar2 == 0) goto LAB_0012a55b;
  }
  apcStack_188[0] = test_bson_iter_mixed;
  test_bson_iter_utf8_cold_8();
  pcStack_308 = (code *)0x12a661;
  uStack_1a0 = uVar4;
  pcStack_198 = unaff_R14;
  pcStack_190 = unaff_R15;
  apcStack_188[0] = (code *)&stack0xfffffffffffffff8;
  pbVar6 = (bson_t *)bson_new();
  pcStack_308 = (code *)0x12a669;
  uVar4 = bson_new();
  uStack_240 = 0;
  uStack_248 = 1;
  pcStack_308 = (code *)0x12a6a5;
  cVar1 = bson_append_utf8(uVar4,"foo",0xffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x12a96c;
    test_bson_iter_mixed_cold_1();
LAB_0012a96c:
    pcStack_308 = (code *)0x12a971;
    test_bson_iter_mixed_cold_2();
LAB_0012a971:
    pcStack_308 = (code *)0x12a976;
    test_bson_iter_mixed_cold_3();
LAB_0012a976:
    pcStack_308 = (code *)0x12a97b;
    test_bson_iter_mixed_cold_4();
LAB_0012a97b:
    pcStack_308 = (code *)0x12a980;
    test_bson_iter_mixed_cold_5();
LAB_0012a980:
    pcStack_308 = (code *)0x12a985;
    test_bson_iter_mixed_cold_6();
LAB_0012a985:
    pcStack_308 = (code *)0x12a98a;
    test_bson_iter_mixed_cold_7();
LAB_0012a98a:
    pcStack_308 = (code *)0x12a98f;
    test_bson_iter_mixed_cold_8();
LAB_0012a98f:
    pcStack_308 = (code *)0x12a994;
    test_bson_iter_mixed_cold_9();
LAB_0012a994:
    pcStack_308 = (code *)0x12a999;
    test_bson_iter_mixed_cold_10();
LAB_0012a999:
    pcStack_308 = (code *)0x12a99e;
    test_bson_iter_mixed_cold_11();
LAB_0012a99e:
    pcStack_308 = (code *)0x12a9a3;
    test_bson_iter_mixed_cold_12();
LAB_0012a9a3:
    pcStack_308 = (code *)0x12a9a8;
    test_bson_iter_mixed_cold_13();
LAB_0012a9a8:
    pcStack_308 = (code *)0x12a9ad;
    test_bson_iter_mixed_cold_14();
LAB_0012a9ad:
    pcStack_308 = (code *)0x12a9b2;
    test_bson_iter_mixed_cold_15();
LAB_0012a9b2:
    pcStack_308 = (code *)0x12a9b7;
    test_bson_iter_mixed_cold_16();
LAB_0012a9b7:
    pcStack_308 = (code *)0x12a9bc;
    test_bson_iter_mixed_cold_17();
LAB_0012a9bc:
    pcStack_308 = (code *)0x12a9c1;
    test_bson_iter_mixed_cold_18();
LAB_0012a9c1:
    pcStack_308 = (code *)0x12a9c6;
    test_bson_iter_mixed_cold_19();
LAB_0012a9c6:
    pcStack_308 = (code *)0x12a9cb;
    test_bson_iter_mixed_cold_20();
LAB_0012a9cb:
    pcStack_308 = (code *)0x12a9d0;
    test_bson_iter_mixed_cold_31();
LAB_0012a9d0:
    pcStack_308 = (code *)0x12a9d5;
    test_bson_iter_mixed_cold_21();
LAB_0012a9d5:
    pcStack_308 = (code *)0x12a9da;
    test_bson_iter_mixed_cold_22();
LAB_0012a9da:
    pcStack_308 = (code *)0x12a9df;
    test_bson_iter_mixed_cold_23();
LAB_0012a9df:
    pcStack_308 = (code *)0x12a9e4;
    test_bson_iter_mixed_cold_24();
LAB_0012a9e4:
    pcStack_308 = (code *)0x12a9e9;
    test_bson_iter_mixed_cold_25();
LAB_0012a9e9:
    pcStack_308 = (code *)0x12a9ee;
    test_bson_iter_mixed_cold_26();
LAB_0012a9ee:
    pcStack_308 = (code *)0x12a9f3;
    test_bson_iter_mixed_cold_27();
LAB_0012a9f3:
    pcStack_308 = (code *)0x12a9f8;
    test_bson_iter_mixed_cold_28();
LAB_0012a9f8:
    pcStack_308 = (code *)0x12a9fd;
    test_bson_iter_mixed_cold_29();
  }
  else {
    pcStack_308 = (code *)0x12a6c8;
    cVar1 = bson_append_code(pbVar6,"0",0xffffffff,"var a = {};");
    if (cVar1 == '\0') goto LAB_0012a96c;
    pcStack_308 = (code *)0x12a6ee;
    cVar1 = bson_append_code_with_scope(pbVar6,"1",0xffffffff,"var b = {};",uVar4);
    if (cVar1 == '\0') goto LAB_0012a971;
    pcStack_308 = (code *)0x12a70f;
    cVar1 = bson_append_int32(pbVar6,"2",0xffffffff,0x4d2);
    if (cVar1 == '\0') goto LAB_0012a976;
    pcStack_308 = (code *)0x12a730;
    cVar1 = bson_append_int64(pbVar6,"3",0xffffffff,0x11d7);
    if (cVar1 == '\0') goto LAB_0012a97b;
    pcStack_308 = (code *)0x12a751;
    cVar1 = bson_append_time_t(pbVar6,"4",0xffffffff,0x1e240);
    if (cVar1 == '\0') goto LAB_0012a980;
    pcStack_308 = (code *)0x12a775;
    cVar1 = bson_append_decimal128(pbVar6,"5",0xffffffff,&uStack_248);
    if (cVar1 == '\0') goto LAB_0012a985;
    pcStack_308 = (code *)0x12a788;
    cVar1 = bson_iter_init(auStack_300,pbVar6);
    if (cVar1 == '\0') goto LAB_0012a98a;
    pcStack_308 = (code *)0x12a798;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012a98f;
    pcStack_308 = (code *)0x12a7a8;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0xd) goto LAB_0012a994;
    pcStack_308 = (code *)0x12a7b9;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012a999;
    pcStack_308 = (code *)0x12a7c9;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0xf) goto LAB_0012a99e;
    pcStack_308 = (code *)0x12a7da;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012a9a3;
    pcStack_308 = (code *)0x12a7ea;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0x10) goto LAB_0012a9a8;
    pcStack_308 = (code *)0x12a7fb;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012a9ad;
    pcStack_308 = (code *)0x12a80b;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0x12) goto LAB_0012a9b2;
    pcStack_308 = (code *)0x12a81c;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012a9b7;
    pcStack_308 = (code *)0x12a82c;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 9) goto LAB_0012a9bc;
    pcStack_308 = (code *)0x12a83d;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012a9c1;
    pcStack_308 = (code *)0x12a84d;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0x13) goto LAB_0012a9c6;
    pcStack_308 = (code *)0x12a85e;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 != '\0') goto LAB_0012a9cb;
    pcStack_308 = (code *)0x12a878;
    cVar1 = bson_iter_init_find(auStack_300,pbVar6,"3");
    if (cVar1 == '\0') goto LAB_0012a9d0;
    pcStack_308 = (code *)0x12a888;
    pcVar5 = (char *)bson_iter_key(auStack_300);
    if ((*pcVar5 != '3') || (pcVar5[1] != '\0')) goto LAB_0012a9d5;
    pcStack_308 = (code *)0x12a8a3;
    lVar7 = bson_iter_int64(auStack_300);
    if (lVar7 != 0x11d7) goto LAB_0012a9da;
    pcStack_308 = (code *)0x12a8b7;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012a9df;
    pcStack_308 = (code *)0x12a8c7;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 9) goto LAB_0012a9e4;
    pcStack_308 = (code *)0x12a8d8;
    lVar7 = bson_iter_time_t(auStack_300);
    if (lVar7 != 0x1e240) goto LAB_0012a9e9;
    pcStack_308 = (code *)0x12a8ec;
    lVar7 = bson_iter_date_time(auStack_300);
    if (lVar7 != 0x75bca00) goto LAB_0012a9ee;
    pcStack_308 = (code *)0x12a900;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') goto LAB_0012a9f3;
    pcStack_308 = (code *)0x12a91b;
    bson_iter_decimal128(auStack_300,auStack_238);
    auVar20[0] = -((char)uStack_248 == auStack_238[0]);
    auVar20[1] = -(uStack_248._1_1_ == auStack_238[1]);
    auVar20[2] = -(uStack_248._2_1_ == auStack_238[2]);
    auVar20[3] = -(uStack_248._3_1_ == auStack_238[3]);
    auVar20[4] = -(uStack_248._4_1_ == auStack_238[4]);
    auVar20[5] = -(uStack_248._5_1_ == auStack_238[5]);
    auVar20[6] = -(uStack_248._6_1_ == auStack_238[6]);
    auVar20[7] = -(uStack_248._7_1_ == auStack_238[7]);
    auVar20[8] = -((char)uStack_240 == auStack_238[8]);
    auVar20[9] = -(uStack_240._1_1_ == auStack_238[9]);
    auVar20[10] = -(uStack_240._2_1_ == auStack_238[10]);
    auVar20[0xb] = -(uStack_240._3_1_ == auStack_238[0xb]);
    auVar20[0xc] = -(uStack_240._4_1_ == auStack_238[0xc]);
    auVar20[0xd] = -(uStack_240._5_1_ == auStack_238[0xd]);
    auVar20[0xe] = -(uStack_240._6_1_ == auStack_238[0xe]);
    auVar20[0xf] = -(uStack_240._7_1_ == auStack_238[0xf]);
    if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_0012a9f8;
    pcStack_308 = (code *)0x12a944;
    cVar1 = bson_iter_next(auStack_300);
    if (cVar1 == '\0') {
      pcStack_308 = (code *)0x12a954;
      bson_destroy(pbVar6);
      pcStack_308 = (code *)0x12a95c;
      bson_destroy(uVar4);
      return;
    }
  }
  pcStack_308 = test_bson_iter_overflow;
  test_bson_iter_mixed_cold_30();
  pcStack_408 = (code *)0x12aa1e;
  pbStack_310 = pbVar6;
  pcStack_308 = (code *)apcStack_188;
  pbVar8 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow1.bson"
                   );
  if (pbVar8 == (bson_t *)0x0) {
    pcStack_408 = (code *)0x12aa2f;
    pbVar8 = get_bson(
                     "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow2.bson"
                     );
    if (pbVar8 == (bson_t *)0x0) goto LAB_0012aa66;
    pcStack_408 = (code *)0x12aa42;
    cVar1 = bson_iter_init(auStack_400,pbVar8);
    pbVar6 = pbVar8;
    if (cVar1 == '\0') goto LAB_0012aa6b;
    pcStack_408 = (code *)0x12aa4e;
    cVar1 = bson_iter_next(auStack_400);
    if (cVar1 == '\0') {
      pcStack_408 = (code *)0x12aa5a;
      bson_destroy(pbVar8);
      return;
    }
  }
  else {
    pcStack_408 = (code *)0x12aa66;
    test_bson_iter_overflow_cold_1();
LAB_0012aa66:
    pcStack_408 = (code *)0x12aa6b;
    test_bson_iter_overflow_cold_4();
LAB_0012aa6b:
    pcStack_408 = (code *)0x12aa70;
    test_bson_iter_overflow_cold_2();
  }
  pcStack_408 = test_bson_iter_timeval;
  test_bson_iter_overflow_cold_3();
  apcStack_588[0] = (code *)0x12aa93;
  pbStack_418 = pbVar6;
  uStack_410 = uVar4;
  pcStack_408 = (code *)&pcStack_308;
  pbVar8 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test26.bson"
                   );
  if (pbVar8 == (bson_t *)0x0) {
    apcStack_588[0] = (code *)0x12aafc;
    test_bson_iter_timeval_cold_5();
LAB_0012aafc:
    apcStack_588[0] = (code *)0x12ab01;
    test_bson_iter_timeval_cold_1();
LAB_0012ab01:
    apcStack_588[0] = (code *)0x12ab06;
    test_bson_iter_timeval_cold_2();
LAB_0012ab06:
    apcStack_588[0] = (code *)0x12ab0b;
    test_bson_iter_timeval_cold_3();
  }
  else {
    apcStack_588[0] = (code *)0x12aaab;
    cVar1 = bson_iter_init(auStack_500,pbVar8);
    pbVar6 = pbVar8;
    if (cVar1 == '\0') goto LAB_0012aafc;
    apcStack_588[0] = (code *)0x12aabc;
    cVar1 = bson_iter_next(auStack_500);
    if (cVar1 == '\0') goto LAB_0012ab01;
    apcStack_588[0] = (code *)0x12aad5;
    bson_iter_timeval(auStack_500,&lStack_510);
    if (lStack_510 != 0x499602d2) goto LAB_0012ab06;
    if (lStack_508 == 0) {
      apcStack_588[0] = (code *)0x12aaee;
      bson_destroy(pbVar8);
      return;
    }
  }
  apcStack_588[0] = test_bson_iter_trailing_null;
  test_bson_iter_timeval_cold_4();
  pcStack_688 = (code *)0x12ab2c;
  pbStack_590 = pbVar6;
  apcStack_588[0] = (code *)&pcStack_408;
  pbVar8 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/trailingnull.bson"
                   );
  if (pbVar8 == (bson_t *)0x0) {
    pcStack_688 = (code *)0x12ab63;
    test_bson_iter_trailing_null_cold_3();
  }
  else {
    pcStack_688 = (code *)0x12ab3f;
    cVar1 = bson_iter_init(auStack_680,pbVar8);
    pbVar6 = pbVar8;
    if (cVar1 != '\0') {
      pcStack_688 = (code *)0x12ab4b;
      cVar1 = bson_iter_next(auStack_680);
      if (cVar1 == '\0') {
        pcStack_688 = (code *)0x12ab57;
        bson_destroy(pbVar8);
        return;
      }
      goto LAB_0012ab68;
    }
  }
  pcStack_688 = (code *)0x12ab68;
  test_bson_iter_trailing_null_cold_1();
LAB_0012ab68:
  pcStack_688 = test_bson_iter_fuzz;
  test_bson_iter_trailing_null_cold_2();
  puVar17 = (undefined1 *)0x0;
  uVar18 = 0xfff66;
  pbStack_6b0 = pbVar6;
  pcStack_688 = (code *)apcStack_588;
  do {
    apcStack_888[0] = (code *)0x12aba0;
    puVar9 = (undefined4 *)bson_malloc0(0x200);
    *puVar9 = 0x200;
    uVar16 = 0;
    do {
      apcStack_888[0] = (code *)0x12abb1;
      iVar2 = rand();
      *(int *)((long)puVar9 + uVar16 + 4) = iVar2;
      uVar16 = uVar16 + 4;
    } while (uVar16 < 0x1fc);
    apcStack_888[0] = (code *)0x12abd0;
    lVar7 = bson_new_from_data(puVar9,0x200);
    if (lVar7 != 0) {
      apcStack_888[0] = (code *)0x12abe7;
      cVar1 = bson_iter_init(auStack_800,lVar7);
      if (cVar1 == '\0') {
LAB_0012ad0b:
        apcStack_888[0] = (code *)0x12ad10;
        test_bson_iter_fuzz_cold_1();
LAB_0012ad10:
        apcStack_888[0] = (code *)0x12ad15;
        test_bson_iter_fuzz_cold_8();
LAB_0012ad15:
        apcStack_888[0] = (code *)0x12ad1a;
        test_bson_iter_fuzz_cold_4();
LAB_0012ad1a:
        apcStack_888[0] = (code *)0x12ad1f;
        test_bson_iter_fuzz_cold_5();
LAB_0012ad1f:
        apcStack_888[0] = (code *)0x12ad24;
        test_bson_iter_fuzz_cold_7();
LAB_0012ad24:
        apcStack_888[0] = (code *)0x12ad29;
        test_bson_iter_fuzz_cold_6();
LAB_0012ad29:
        apcStack_888[0] = (code *)0x12ad2e;
        test_bson_iter_fuzz_cold_3();
LAB_0012ad2e:
        apcStack_888[0] = test_bson_iter_regex;
        test_bson_iter_fuzz_cold_9();
        pcStack_988 = (code *)0x12ad48;
        puStack_890 = auStack_800;
        apcStack_888[0] = (code *)&pcStack_688;
        uVar4 = bson_new();
        pcStack_988 = (code *)0x12ad6d;
        cVar1 = bson_append_regex(uVar4,"foo",0xffffffff,"^abcd","");
        if (cVar1 == '\0') {
          pcStack_988 = (code *)0x12ae04;
          test_bson_iter_regex_cold_1();
LAB_0012ae04:
          pcStack_988 = (code *)0x12ae09;
          test_bson_iter_regex_cold_2();
LAB_0012ae09:
          pcStack_988 = (code *)0x12ae0e;
          test_bson_iter_regex_cold_3();
LAB_0012ae0e:
          pcStack_988 = (code *)0x12ae13;
          test_bson_iter_regex_cold_4();
LAB_0012ae13:
          pcStack_988 = (code *)0x12ae18;
          test_bson_iter_regex_cold_5();
LAB_0012ae18:
          pcStack_988 = (code *)0x12ae1d;
          test_bson_iter_regex_cold_6();
        }
        else {
          pcStack_988 = (code *)0x12ad93;
          cVar1 = bson_append_regex(uVar4,"foo",0xffffffff,"^abcd",0);
          if (cVar1 == '\0') goto LAB_0012ae04;
          pcStack_988 = (code *)0x12adb9;
          cVar1 = bson_append_regex(uVar4,"foo",0xffffffff,"^abcd","ix");
          if (cVar1 == '\0') goto LAB_0012ae09;
          pcStack_988 = (code *)0x12adc8;
          cVar1 = bson_iter_init(auStack_980,uVar4);
          if (cVar1 == '\0') goto LAB_0012ae0e;
          pcStack_988 = (code *)0x12add4;
          cVar1 = bson_iter_next(auStack_980);
          if (cVar1 == '\0') goto LAB_0012ae13;
          pcStack_988 = (code *)0x12ade0;
          cVar1 = bson_iter_next(auStack_980);
          if (cVar1 == '\0') goto LAB_0012ae18;
          pcStack_988 = (code *)0x12adec;
          cVar1 = bson_iter_next(auStack_980);
          if (cVar1 != '\0') {
            pcStack_988 = (code *)0x12adf8;
            bson_destroy(uVar4);
            return;
          }
        }
        pcStack_988 = test_bson_iter_next_after_finish;
        test_bson_iter_regex_cold_7();
        uStack_990 = 0xfff66;
        pcStack_a88 = (code *)0x12ae3b;
        uStack_9a0 = uVar4;
        puStack_998 = puVar17;
        pcStack_988 = (code *)apcStack_888;
        uVar4 = bson_new();
        pcStack_a88 = (code *)0x12ae57;
        cVar1 = bson_append_int32(uVar4,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') goto LAB_0012aea8;
        pcStack_a88 = (code *)0x12ae66;
        cVar1 = bson_iter_init(auStack_a80,uVar4);
        if (cVar1 == '\0') goto LAB_0012aead;
        pcStack_a88 = (code *)0x12ae72;
        cVar1 = bson_iter_next(auStack_a80);
        if (cVar1 != '\0') {
          uVar18 = 1000;
          while( true ) {
            pcStack_a88 = (code *)0x12ae87;
            cVar1 = bson_iter_next(auStack_a80);
            if (cVar1 != '\0') break;
            uVar3 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar3;
            if (uVar3 == 0) {
              pcStack_a88 = (code *)0x12ae98;
              bson_destroy(uVar4);
              return;
            }
          }
          pcStack_a88 = (code *)0x12aea8;
          test_bson_iter_next_after_finish_cold_4();
          puVar17 = auStack_a80;
LAB_0012aea8:
          pcStack_a88 = (code *)0x12aead;
          test_bson_iter_next_after_finish_cold_1();
LAB_0012aead:
          pcStack_a88 = (code *)0x12aeb2;
          test_bson_iter_next_after_finish_cold_2();
        }
        pcStack_a88 = test_bson_iter_find_case;
        test_bson_iter_next_after_finish_cold_3();
        pcStack_c88 = (code *)0x12aed7;
        uStack_a90 = uVar4;
        pcStack_a88 = (code *)&pcStack_988;
        bson_init(auStack_c00);
        pcStack_c88 = (code *)0x12aef8;
        cVar1 = bson_append_utf8(auStack_c00,"key",0xffffffff,"value",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_c88 = (code *)0x12af63;
          test_bson_iter_find_case_cold_1();
LAB_0012af63:
          pcStack_c88 = (code *)0x12af68;
          test_bson_iter_find_case_cold_2();
LAB_0012af68:
          pcStack_c88 = (code *)0x12af6d;
          test_bson_iter_find_case_cold_3();
LAB_0012af6d:
          pcStack_c88 = (code *)0x12af72;
          test_bson_iter_find_case_cold_4();
        }
        else {
          pcStack_c88 = (code *)0x12af0c;
          cVar1 = bson_iter_init(auStack_c80,auStack_c00);
          if (cVar1 == '\0') goto LAB_0012af63;
          pcStack_c88 = (code *)0x12af1f;
          cVar1 = bson_iter_find_case(auStack_c80,"KEY");
          if (cVar1 == '\0') goto LAB_0012af68;
          pcStack_c88 = (code *)0x12af33;
          cVar1 = bson_iter_init(auStack_c80,auStack_c00);
          if (cVar1 == '\0') goto LAB_0012af6d;
          pcStack_c88 = (code *)0x12af46;
          cVar1 = bson_iter_find(auStack_c80,"KEY");
          if (cVar1 == '\0') {
            pcStack_c88 = (code *)0x12af57;
            bson_destroy(auStack_c00);
            return;
          }
        }
        pcStack_c88 = test_bson_iter_as_double;
        test_bson_iter_find_case_cold_5();
        pcStack_e88 = (code *)0x12af97;
        puStack_c90 = auStack_c00;
        pcStack_c88 = (code *)&pcStack_a88;
        bson_init(auStack_e00);
        pcStack_e88 = (code *)0x12afb3;
        cVar1 = bson_append_double(0x4093487e5c91d14e,auStack_e00,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_e88 = (code *)0x12b116;
          test_bson_iter_as_double_cold_1();
LAB_0012b116:
          pcStack_e88 = (code *)0x12b11b;
          test_bson_iter_as_double_cold_2();
LAB_0012b11b:
          pcStack_e88 = (code *)0x12b120;
          test_bson_iter_as_double_cold_3();
LAB_0012b120:
          pcStack_e88 = (code *)0x12b125;
          test_bson_iter_as_double_cold_4();
LAB_0012b125:
          pcStack_e88 = (code *)0x12b12a;
          test_bson_iter_as_double_cold_5();
LAB_0012b12a:
          pcStack_e88 = (code *)0x12b12f;
          test_bson_iter_as_double_cold_6();
LAB_0012b12f:
          pcStack_e88 = (code *)0x12b134;
          test_bson_iter_as_double_cold_7();
LAB_0012b134:
          pcStack_e88 = (code *)0x12b139;
          test_bson_iter_as_double_cold_8();
LAB_0012b139:
          pcStack_e88 = (code *)0x12b13e;
          test_bson_iter_as_double_cold_9();
LAB_0012b13e:
          pcStack_e88 = (code *)0x12b143;
          test_bson_iter_as_double_cold_10();
LAB_0012b143:
          pcStack_e88 = (code *)0x12b148;
          test_bson_iter_as_double_cold_11();
        }
        else {
          pcStack_e88 = (code *)0x12afd2;
          cVar1 = bson_iter_init_find(auStack_e80,auStack_e00,"key");
          if (cVar1 == '\0') goto LAB_0012b116;
          pcStack_e88 = (code *)0x12afe2;
          iVar2 = bson_iter_type(auStack_e80);
          if (iVar2 != 1) goto LAB_0012b11b;
          pcStack_e88 = (code *)0x12aff3;
          dVar19 = (double)bson_iter_as_double(auStack_e80);
          if ((dVar19 != 1234.1234) || (NAN(dVar19))) goto LAB_0012b120;
          pcStack_e88 = (code *)0x12b017;
          bson_destroy(auStack_e00);
          pcStack_e88 = (code *)0x12b01f;
          bson_init(auStack_e00);
          pcStack_e88 = (code *)0x12b038;
          cVar1 = bson_append_int32(auStack_e00,"key",0xffffffff,0x4d2);
          if (cVar1 == '\0') goto LAB_0012b125;
          pcStack_e88 = (code *)0x12b057;
          cVar1 = bson_iter_init_find(auStack_e80,auStack_e00,"key");
          if (cVar1 == '\0') goto LAB_0012b12a;
          pcStack_e88 = (code *)0x12b067;
          iVar2 = bson_iter_type(auStack_e80);
          if (iVar2 != 0x10) goto LAB_0012b12f;
          pcStack_e88 = (code *)0x12b078;
          dVar19 = (double)bson_iter_as_double(auStack_e80);
          if ((dVar19 != 1234.0) || (NAN(dVar19))) goto LAB_0012b134;
          pcStack_e88 = (code *)0x12b09c;
          bson_destroy(auStack_e00);
          pcStack_e88 = (code *)0x12b0a4;
          bson_init(auStack_e00);
          pcStack_e88 = (code *)0x12b0bd;
          cVar1 = bson_append_int64(auStack_e00,"key",0xffffffff,0x10e1);
          if (cVar1 == '\0') goto LAB_0012b139;
          pcStack_e88 = (code *)0x12b0d8;
          cVar1 = bson_iter_init_find(auStack_e80,auStack_e00,"key");
          if (cVar1 == '\0') goto LAB_0012b13e;
          pcStack_e88 = (code *)0x12b0e4;
          iVar2 = bson_iter_type(auStack_e80);
          if (iVar2 != 0x12) goto LAB_0012b143;
          pcStack_e88 = (code *)0x12b0f1;
          dVar19 = (double)bson_iter_as_double(auStack_e80);
          if ((dVar19 == 4321.0) && (!NAN(dVar19))) {
            pcStack_e88 = (code *)0x12b10a;
            bson_destroy(auStack_e00);
            return;
          }
        }
        pcStack_e88 = test_bson_iter_overwrite_int32;
        test_bson_iter_as_double_cold_12();
        puVar10 = auStack_1000;
        pcStack_1088 = (code *)0x12b16d;
        puStack_e90 = auStack_e00;
        pcStack_e88 = (code *)&pcStack_c88;
        bson_init(puVar10);
        pcStack_1088 = (code *)0x12b186;
        cVar1 = bson_append_int32(puVar10,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1088 = (code *)0x12b216;
          test_bson_iter_overwrite_int32_cold_1();
LAB_0012b216:
          pcStack_1088 = (code *)0x12b21b;
          test_bson_iter_overwrite_int32_cold_2();
LAB_0012b21b:
          pcStack_1088 = (code *)0x12b220;
          test_bson_iter_overwrite_int32_cold_3();
LAB_0012b220:
          pcStack_1088 = (code *)0x12b225;
          test_bson_iter_overwrite_int32_cold_4();
LAB_0012b225:
          pcStack_1088 = (code *)0x12b22a;
          test_bson_iter_overwrite_int32_cold_5();
        }
        else {
          pcStack_1088 = (code *)0x12b1a5;
          cVar1 = bson_iter_init_find(auStack_1080,auStack_1000,"key");
          if (cVar1 == '\0') goto LAB_0012b216;
          pcStack_1088 = (code *)0x12b1b1;
          iVar2 = bson_iter_type(auStack_1080);
          if (iVar2 != 0x10) goto LAB_0012b21b;
          pcStack_1088 = (code *)0x12b1c6;
          bson_iter_overwrite_int32(auStack_1080,0x10e1);
          pcStack_1088 = (code *)0x12b1dd;
          cVar1 = bson_iter_init_find(auStack_1080,auStack_1000,"key");
          puVar10 = auStack_1080;
          if (cVar1 == '\0') goto LAB_0012b220;
          pcStack_1088 = (code *)0x12b1e9;
          iVar2 = bson_iter_type(auStack_1080);
          puVar10 = auStack_1080;
          if (iVar2 != 0x10) goto LAB_0012b225;
          pcStack_1088 = (code *)0x12b1f6;
          iVar2 = bson_iter_int32(auStack_1080);
          puVar10 = auStack_1080;
          if (iVar2 == 0x10e1) {
            pcStack_1088 = (code *)0x12b20a;
            bson_destroy(auStack_1000);
            return;
          }
        }
        pcStack_1088 = test_bson_iter_overwrite_int64;
        test_bson_iter_overwrite_int32_cold_6();
        puVar11 = auStack_1200;
        pcStack_1288 = (code *)0x12b24f;
        puStack_1090 = puVar10;
        pcStack_1088 = (code *)&pcStack_e88;
        bson_init(puVar11);
        pcStack_1288 = (code *)0x12b268;
        cVar1 = bson_append_int64(puVar11,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1288 = (code *)0x12b2f9;
          test_bson_iter_overwrite_int64_cold_1();
LAB_0012b2f9:
          pcStack_1288 = (code *)0x12b2fe;
          test_bson_iter_overwrite_int64_cold_2();
LAB_0012b2fe:
          pcStack_1288 = (code *)0x12b303;
          test_bson_iter_overwrite_int64_cold_3();
LAB_0012b303:
          pcStack_1288 = (code *)0x12b308;
          test_bson_iter_overwrite_int64_cold_4();
LAB_0012b308:
          pcStack_1288 = (code *)0x12b30d;
          test_bson_iter_overwrite_int64_cold_5();
        }
        else {
          pcStack_1288 = (code *)0x12b287;
          cVar1 = bson_iter_init_find(auStack_1280,auStack_1200,"key");
          if (cVar1 == '\0') goto LAB_0012b2f9;
          pcStack_1288 = (code *)0x12b293;
          iVar2 = bson_iter_type(auStack_1280);
          if (iVar2 != 0x12) goto LAB_0012b2fe;
          pcStack_1288 = (code *)0x12b2a8;
          bson_iter_overwrite_int64(auStack_1280,0x1221);
          pcStack_1288 = (code *)0x12b2bf;
          cVar1 = bson_iter_init_find(auStack_1280,auStack_1200,"key");
          puVar11 = auStack_1280;
          if (cVar1 == '\0') goto LAB_0012b303;
          pcStack_1288 = (code *)0x12b2cb;
          iVar2 = bson_iter_type(auStack_1280);
          puVar11 = auStack_1280;
          if (iVar2 != 0x12) goto LAB_0012b308;
          pcStack_1288 = (code *)0x12b2d8;
          lVar7 = bson_iter_int64(auStack_1280);
          puVar11 = auStack_1280;
          if (lVar7 == 0x1221) {
            pcStack_1288 = (code *)0x12b2ed;
            bson_destroy(auStack_1200);
            return;
          }
        }
        pcStack_1288 = test_bson_iter_overwrite_double;
        test_bson_iter_overwrite_int64_cold_6();
        puVar10 = auStack_1400;
        pcStack_1488 = (code *)0x12b332;
        puStack_1290 = puVar11;
        pcStack_1288 = (code *)&pcStack_1088;
        bson_init(puVar10);
        pcStack_1488 = (code *)0x12b34e;
        cVar1 = bson_append_double(0x4093487e5c91d14e,puVar10,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_1488 = (code *)0x12b3e6;
          test_bson_iter_overwrite_double_cold_1();
LAB_0012b3e6:
          pcStack_1488 = (code *)0x12b3eb;
          test_bson_iter_overwrite_double_cold_2();
LAB_0012b3eb:
          pcStack_1488 = (code *)0x12b3f0;
          test_bson_iter_overwrite_double_cold_3();
LAB_0012b3f0:
          pcStack_1488 = (code *)0x12b3f5;
          test_bson_iter_overwrite_double_cold_4();
LAB_0012b3f5:
          pcStack_1488 = (code *)0x12b3fa;
          test_bson_iter_overwrite_double_cold_5();
        }
        else {
          pcStack_1488 = (code *)0x12b36d;
          cVar1 = bson_iter_init_find(auStack_1480,auStack_1400,"key");
          if (cVar1 == '\0') goto LAB_0012b3e6;
          pcStack_1488 = (code *)0x12b379;
          iVar2 = bson_iter_type(auStack_1480);
          if (iVar2 != 1) goto LAB_0012b3eb;
          pcStack_1488 = (code *)0x12b391;
          bson_iter_overwrite_double(0x40b2211f97247454,auStack_1480);
          pcStack_1488 = (code *)0x12b3a8;
          cVar1 = bson_iter_init_find(auStack_1480,auStack_1400,"key");
          puVar10 = auStack_1480;
          if (cVar1 == '\0') goto LAB_0012b3f0;
          pcStack_1488 = (code *)0x12b3b4;
          iVar2 = bson_iter_type(auStack_1480);
          puVar10 = auStack_1480;
          if (iVar2 != 1) goto LAB_0012b3f5;
          pcStack_1488 = (code *)0x12b3c1;
          dVar19 = (double)bson_iter_double(auStack_1480);
          puVar10 = auStack_1480;
          if ((dVar19 == 4641.1234) && (puVar10 = auStack_1480, !NAN(dVar19))) {
            pcStack_1488 = (code *)0x12b3da;
            bson_destroy(auStack_1400);
            return;
          }
        }
        pcStack_1488 = test_bson_iter_overwrite_bool;
        test_bson_iter_overwrite_double_cold_6();
        puVar11 = auStack_1600;
        pcStack_1688 = (code *)0x12b41f;
        puStack_1490 = puVar10;
        pcStack_1488 = (code *)&pcStack_1288;
        bson_init(puVar11);
        pcStack_1688 = (code *)0x12b438;
        cVar1 = bson_append_bool(puVar11,"key",0xffffffff,1);
        if (cVar1 == '\0') {
          pcStack_1688 = (code *)0x12b4be;
          test_bson_iter_overwrite_bool_cold_1();
LAB_0012b4be:
          pcStack_1688 = (code *)0x12b4c3;
          test_bson_iter_overwrite_bool_cold_2();
LAB_0012b4c3:
          pcStack_1688 = (code *)0x12b4c8;
          test_bson_iter_overwrite_bool_cold_3();
LAB_0012b4c8:
          pcStack_1688 = (code *)0x12b4cd;
          test_bson_iter_overwrite_bool_cold_4();
LAB_0012b4cd:
          pcStack_1688 = (code *)0x12b4d2;
          test_bson_iter_overwrite_bool_cold_5();
        }
        else {
          pcStack_1688 = (code *)0x12b453;
          cVar1 = bson_iter_init_find(auStack_1680,auStack_1600,"key");
          if (cVar1 == '\0') goto LAB_0012b4be;
          pcStack_1688 = (code *)0x12b45f;
          iVar2 = bson_iter_type(auStack_1680);
          if (iVar2 != 8) goto LAB_0012b4c3;
          pcStack_1688 = (code *)0x12b471;
          bson_iter_overwrite_bool(auStack_1680,0);
          pcStack_1688 = (code *)0x12b488;
          cVar1 = bson_iter_init_find(auStack_1680,auStack_1600,"key");
          puVar11 = auStack_1680;
          if (cVar1 == '\0') goto LAB_0012b4c8;
          pcStack_1688 = (code *)0x12b494;
          iVar2 = bson_iter_type(auStack_1680);
          puVar11 = auStack_1680;
          if (iVar2 != 8) goto LAB_0012b4cd;
          pcStack_1688 = (code *)0x12b4a1;
          cVar1 = bson_iter_bool(auStack_1680);
          puVar11 = auStack_1680;
          if (cVar1 == '\0') {
            pcStack_1688 = (code *)0x12b4b2;
            bson_destroy(auStack_1600);
            return;
          }
        }
        pcStack_1688 = test_bson_iter_overwrite_decimal128;
        test_bson_iter_overwrite_bool_cold_6();
        puVar12 = &uStack_1810;
        uStack_1808 = 0;
        uStack_1810 = 1;
        uStack_1898 = 0;
        uStack_18a0 = 2;
        puVar10 = auStack_1800;
        apcStack_1908[0] = (code *)0x12b51c;
        puStack_1698 = puVar11;
        puStack_1690 = puVar17;
        pcStack_1688 = (code *)&pcStack_1488;
        bson_init(puVar10);
        apcStack_1908[0] = (code *)0x12b533;
        cVar1 = bson_append_decimal128(puVar10,"key",0xffffffff,puVar12);
        if (cVar1 == '\0') {
          apcStack_1908[0] = (code *)0x12b603;
          test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b603:
          apcStack_1908[0] = (code *)0x12b608;
          test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b608:
          apcStack_1908[0] = (code *)0x12b60d;
          test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b60d:
          apcStack_1908[0] = (code *)0x12b612;
          test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b612:
          apcStack_1908[0] = (code *)0x12b617;
          test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b617:
          apcStack_1908[0] = (code *)0x12b61c;
          test_bson_iter_overwrite_decimal128_cold_6();
        }
        else {
          apcStack_1908[0] = (code *)0x12b557;
          cVar1 = bson_iter_init_find(auStack_1880,auStack_1800,"key");
          if (cVar1 == '\0') goto LAB_0012b603;
          apcStack_1908[0] = (code *)0x12b56c;
          iVar2 = bson_iter_type(auStack_1880);
          if (iVar2 != 0x13) goto LAB_0012b608;
          puVar12 = auStack_1880;
          apcStack_1908[0] = (code *)0x12b58a;
          bson_iter_overwrite_decimal128(puVar12,&uStack_18a0);
          apcStack_1908[0] = (code *)0x12b5a1;
          cVar1 = bson_iter_init_find(puVar12,auStack_1800,"key");
          if (cVar1 == '\0') goto LAB_0012b60d;
          apcStack_1908[0] = (code *)0x12b5b2;
          iVar2 = bson_iter_type(auStack_1880);
          if (iVar2 != 0x13) goto LAB_0012b612;
          apcStack_1908[0] = (code *)0x12b5c9;
          cVar1 = bson_iter_decimal128(auStack_1880,auStack_1890);
          if (cVar1 == '\0') goto LAB_0012b617;
          auVar21[0] = -((char)uStack_18a0 == auStack_1890[0]);
          auVar21[1] = -(uStack_18a0._1_1_ == auStack_1890[1]);
          auVar21[2] = -(uStack_18a0._2_1_ == auStack_1890[2]);
          auVar21[3] = -(uStack_18a0._3_1_ == auStack_1890[3]);
          auVar21[4] = -(uStack_18a0._4_1_ == auStack_1890[4]);
          auVar21[5] = -(uStack_18a0._5_1_ == auStack_1890[5]);
          auVar21[6] = -(uStack_18a0._6_1_ == auStack_1890[6]);
          auVar21[7] = -(uStack_18a0._7_1_ == auStack_1890[7]);
          auVar21[8] = -((char)uStack_1898 == auStack_1890[8]);
          auVar21[9] = -(uStack_1898._1_1_ == auStack_1890[9]);
          auVar21[10] = -(uStack_1898._2_1_ == auStack_1890[10]);
          auVar21[0xb] = -(uStack_1898._3_1_ == auStack_1890[0xb]);
          auVar21[0xc] = -(uStack_1898._4_1_ == auStack_1890[0xc]);
          auVar21[0xd] = -(uStack_1898._5_1_ == auStack_1890[0xd]);
          auVar21[0xe] = -(uStack_1898._6_1_ == auStack_1890[0xe]);
          auVar21[0xf] = -(uStack_1898._7_1_ == auStack_1890[0xf]);
          if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
            apcStack_1908[0] = (code *)0x12b5f5;
            bson_destroy(auStack_1800);
            return;
          }
        }
        apcStack_1908[0] = test_bson_iter_recurse;
        test_bson_iter_overwrite_decimal128_cold_7();
        pcStack_1c08 = (code *)0x12b63e;
        puStack_1910 = puVar12;
        apcStack_1908[0] = (code *)&pcStack_1688;
        bson_init(auStack_1a80);
        pcStack_1c08 = (code *)0x12b64e;
        bson_init(auStack_1b80);
        pcStack_1c08 = (code *)0x12b664;
        cVar1 = bson_append_int32(auStack_1b80,"0",1,0);
        if (cVar1 == '\0') {
          pcStack_1c08 = (code *)0x12b79e;
          test_bson_iter_recurse_cold_1();
LAB_0012b79e:
          pcStack_1c08 = (code *)0x12b7a3;
          test_bson_iter_recurse_cold_2();
LAB_0012b7a3:
          pcStack_1c08 = (code *)0x12b7a8;
          test_bson_iter_recurse_cold_3();
LAB_0012b7a8:
          pcStack_1c08 = (code *)0x12b7ad;
          test_bson_iter_recurse_cold_4();
LAB_0012b7ad:
          pcStack_1c08 = (code *)0x12b7b2;
          test_bson_iter_recurse_cold_5();
LAB_0012b7b2:
          pcStack_1c08 = (code *)0x12b7b7;
          test_bson_iter_recurse_cold_6();
LAB_0012b7b7:
          pcStack_1c08 = (code *)0x12b7bc;
          test_bson_iter_recurse_cold_7();
LAB_0012b7bc:
          pcStack_1c08 = (code *)0x12b7c1;
          test_bson_iter_recurse_cold_8();
LAB_0012b7c1:
          pcStack_1c08 = (code *)0x12b7c6;
          test_bson_iter_recurse_cold_9();
LAB_0012b7c6:
          pcStack_1c08 = (code *)0x12b7cb;
          test_bson_iter_recurse_cold_10();
        }
        else {
          pcStack_1c08 = (code *)0x12b68a;
          cVar1 = bson_append_int32(auStack_1b80,"1",1,1);
          if (cVar1 == '\0') goto LAB_0012b79e;
          pcStack_1c08 = (code *)0x12b6b0;
          cVar1 = bson_append_int32(auStack_1b80,"2",1,2);
          if (cVar1 == '\0') goto LAB_0012b7a3;
          pcStack_1c08 = (code *)0x12b6d9;
          cVar1 = bson_append_array(auStack_1a80,"key",0xffffffff,auStack_1b80);
          if (cVar1 == '\0') goto LAB_0012b7a8;
          pcStack_1c08 = (code *)0x12b6fd;
          cVar1 = bson_iter_init_find(auStack_1b00,auStack_1a80,"key");
          if (cVar1 == '\0') goto LAB_0012b7ad;
          pcStack_1c08 = (code *)0x12b712;
          iVar2 = bson_iter_type(auStack_1b00);
          if (iVar2 != 4) goto LAB_0012b7b2;
          pcStack_1c08 = (code *)0x12b72b;
          cVar1 = bson_iter_recurse(auStack_1b00,auStack_1c00);
          if (cVar1 == '\0') goto LAB_0012b7b7;
          pcStack_1c08 = (code *)0x12b742;
          cVar1 = bson_iter_find(auStack_1c00,"0");
          if (cVar1 == '\0') goto LAB_0012b7bc;
          pcStack_1c08 = (code *)0x12b755;
          cVar1 = bson_iter_find(auStack_1c00,"1");
          if (cVar1 == '\0') goto LAB_0012b7c1;
          pcStack_1c08 = (code *)0x12b768;
          cVar1 = bson_iter_find(auStack_1c00,"2");
          if (cVar1 == '\0') goto LAB_0012b7c6;
          pcStack_1c08 = (code *)0x12b774;
          cVar1 = bson_iter_next(auStack_1c00);
          if (cVar1 == '\0') {
            pcStack_1c08 = (code *)0x12b785;
            bson_destroy(auStack_1a80);
            pcStack_1c08 = (code *)0x12b792;
            bson_destroy(auStack_1b80);
            return;
          }
        }
        pcStack_1c08 = test_bson_iter_init_find_case;
        test_bson_iter_recurse_cold_11();
        pcStack_1e08 = (code *)0x12b7f0;
        puStack_1c10 = auStack_1b80;
        pcStack_1c08 = (code *)apcStack_1908;
        bson_init(auStack_1d80);
        pcStack_1e08 = (code *)0x12b809;
        cVar1 = bson_append_int32(auStack_1d80,"FOO",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1e08 = (code *)0x12b850;
          test_bson_iter_init_find_case_cold_1();
LAB_0012b850:
          pcStack_1e08 = (code *)0x12b855;
          test_bson_iter_init_find_case_cold_2();
        }
        else {
          pcStack_1e08 = (code *)0x12b824;
          cVar1 = bson_iter_init_find_case(auStack_1e00,auStack_1d80,"foo");
          if (cVar1 == '\0') goto LAB_0012b850;
          pcStack_1e08 = (code *)0x12b830;
          iVar2 = bson_iter_int32(auStack_1e00);
          if (iVar2 == 0x4d2) {
            pcStack_1e08 = (code *)0x12b844;
            bson_destroy(auStack_1d80);
            return;
          }
        }
        pcStack_1e08 = test_bson_iter_find_descendant;
        test_bson_iter_init_find_case_cold_3();
        pcStack_1f88 = (code *)0x12b878;
        puStack_1e18 = auStack_1d80;
        puStack_1e10 = puVar10;
        pcStack_1e08 = (code *)&pcStack_1c08;
        pbVar6 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                         );
        pcStack_1f88 = (code *)0x12b88b;
        cVar1 = bson_iter_init(auStack_1f00,pbVar6);
        if (cVar1 == '\0') {
          pcStack_1f88 = (code *)0x12bab0;
          test_bson_iter_find_descendant_cold_1();
LAB_0012bab0:
          pcStack_1f88 = (code *)0x12bab5;
          test_bson_iter_find_descendant_cold_2();
LAB_0012bab5:
          pcStack_1f88 = (code *)0x12baba;
          test_bson_iter_find_descendant_cold_3();
LAB_0012baba:
          pcStack_1f88 = (code *)0x12babf;
          test_bson_iter_find_descendant_cold_4();
LAB_0012babf:
          pcStack_1f88 = (code *)0x12bac4;
          test_bson_iter_find_descendant_cold_5();
LAB_0012bac4:
          pcStack_1f88 = (code *)0x12bac9;
          test_bson_iter_find_descendant_cold_6();
LAB_0012bac9:
          pcStack_1f88 = (code *)0x12bace;
          test_bson_iter_find_descendant_cold_7();
LAB_0012bace:
          pcStack_1f88 = (code *)0x12bad3;
          test_bson_iter_find_descendant_cold_8();
LAB_0012bad3:
          pcStack_1f88 = (code *)0x12bad8;
          test_bson_iter_find_descendant_cold_9();
LAB_0012bad8:
          pcStack_1f88 = (code *)0x12badd;
          test_bson_iter_find_descendant_cold_10();
LAB_0012badd:
          pcStack_1f88 = (code *)0x12bae2;
          test_bson_iter_find_descendant_cold_11();
LAB_0012bae2:
          pcStack_1f88 = (code *)0x12bae7;
          test_bson_iter_find_descendant_cold_12();
LAB_0012bae7:
          pcStack_1f88 = (code *)0x12baec;
          test_bson_iter_find_descendant_cold_13();
        }
        else {
          pcStack_1f88 = (code *)0x12b8aa;
          cVar1 = bson_iter_find_descendant(auStack_1f00,"a.b.c.0",auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bab0;
          pcStack_1f88 = (code *)0x12b8ba;
          iVar2 = bson_iter_type(auStack_1f80);
          if (iVar2 != 0x10) goto LAB_0012bab5;
          pcStack_1f88 = (code *)0x12b8cb;
          iVar2 = bson_iter_int32(auStack_1f80);
          if (iVar2 != 1) goto LAB_0012baba;
          pcStack_1f88 = (code *)0x12b8dc;
          bson_destroy(pbVar6);
          pcStack_1f88 = (code *)0x12b8e1;
          pbVar6 = (bson_t *)bson_bcon_magic();
          pcStack_1f88 = (code *)0x0;
          pcStack_1f90 = "}";
          pcStack_1f98 = "]";
          pbStack_1fa0 = (bson_t *)0x14ad57;
          uStack_1fa8 = 1;
          uStack_1fb0 = 0xf;
          pcStack_1fc0 = "baz";
          uStack_1fc8 = 0x12b930;
          pbStack_1fb8 = pbVar6;
          puVar10 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
          pcStack_1f88 = (code *)0x12b947;
          cVar1 = bson_iter_init(auStack_1f00,puVar10);
          if (cVar1 == '\0') goto LAB_0012babf;
          pcStack_1f88 = (code *)0x12b966;
          cVar1 = bson_iter_find_descendant(auStack_1f00,"foo.bar.0.baz",auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bac4;
          pcStack_1f88 = (code *)0x12b976;
          iVar2 = bson_iter_type(auStack_1f80);
          if (iVar2 != 0x10) goto LAB_0012bac9;
          pcStack_1f88 = (code *)0x12b987;
          iVar2 = bson_iter_int32(auStack_1f80);
          if (iVar2 != 1) goto LAB_0012bace;
          pcStack_1f88 = (code *)0x12b998;
          bson_destroy(puVar10);
          pcStack_1f88 = (code *)0x0;
          pcStack_1f90 = (char *)0x2;
          pcStack_1f98 = (char *)0xf;
          uStack_1fa8 = 0x12b9c4;
          pbStack_1fa0 = pbVar6;
          puVar10 = (undefined1 *)bcon_new(0,"nModified",pbVar6,0xf,1,"n");
          pcStack_1f88 = (code *)0x12b9db;
          cVar1 = bson_iter_init(auStack_1f00,puVar10);
          if (cVar1 == '\0') goto LAB_0012bad3;
          pcStack_1f88 = (code *)0x12b9fa;
          cVar1 = bson_iter_find_descendant(auStack_1f00,"n",auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bad8;
          pcStack_1f88 = (code *)0x12ba0a;
          pcVar5 = (char *)bson_iter_key(auStack_1f80);
          if ((*pcVar5 != 'n') || (pcVar5[1] != '\0')) goto LAB_0012badd;
          pcStack_1f88 = (code *)0x12ba25;
          bson_destroy(puVar10);
          pcStack_1f88 = (code *)0x0;
          pcStack_1f90 = (char *)0x2;
          pcStack_1f98 = (char *)0xf;
          uStack_1fa8 = 0x12ba51;
          pbStack_1fa0 = pbVar6;
          pbVar6 = (bson_t *)bcon_new(0,"",pbVar6,0xf,1,"n");
          pcStack_1f88 = (code *)0x12ba68;
          cVar1 = bson_iter_init(auStack_1f00,pbVar6);
          if (cVar1 == '\0') goto LAB_0012bae2;
          pcStack_1f88 = (code *)0x12ba83;
          cVar1 = bson_iter_find_descendant(auStack_1f00,"n",auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bae7;
          pcStack_1f88 = (code *)0x12ba8f;
          pcVar5 = (char *)bson_iter_key(auStack_1f80);
          if ((*pcVar5 == 'n') && (pcVar5[1] == '\0')) {
            pcStack_1f88 = (code *)0x12baa2;
            bson_destroy(pbVar6);
            return;
          }
        }
        pcStack_1f88 = test_bson_iter_as_bool;
        test_bson_iter_find_descendant_cold_14();
        pbVar14 = &bStack_2180;
        pbVar15 = &bStack_2180;
        pbVar8 = &bStack_2180;
        pbVar13 = abStack_2100;
        pcStack_2188 = (code *)0x12bb15;
        pbStack_1fa0 = pbVar6;
        pcStack_1f98 = puVar10;
        pcStack_1f90 = (char *)uVar18;
        pcStack_1f88 = (code *)&pcStack_1e08;
        bson_init(pbVar13);
        pcStack_2188 = (code *)0x12bb2e;
        bson_append_int32(pbVar13,"int32[true]",0xffffffff,1);
        pcStack_2188 = (code *)0x12bb44;
        bson_append_int32(pbVar13,"int32[false]",0xffffffff,0);
        pcStack_2188 = (code *)0x12bb60;
        bson_append_int64(pbVar13,"int64[true]",0xffffffff,1);
        pcStack_2188 = (code *)0x12bb79;
        bson_append_int64(pbVar13,"int64[false]",0xffffffff,0);
        pcStack_2188 = (code *)0x12bb91;
        bson_append_double(0x3ff0000000000000,pbVar13,"int64[true]",0xffffffff);
        pcStack_2188 = (code *)0x12bba4;
        bson_append_double(pbVar13,"int64[false]",0xffffffff);
        pcStack_2188 = (code *)0x12bbb2;
        bson_iter_init(&bStack_2180,pbVar13);
        pcStack_2188 = (code *)0x12bbba;
        bson_iter_next(&bStack_2180);
        pcStack_2188 = (code *)0x12bbc2;
        cVar1 = bson_iter_as_bool(&bStack_2180);
        if (cVar1 == '\0') {
          pcStack_2188 = (code *)0x12bc5a;
          test_bson_iter_as_bool_cold_1();
LAB_0012bc5a:
          pcStack_2188 = (code *)0x12bc5f;
          test_bson_iter_as_bool_cold_6();
LAB_0012bc5f:
          pbVar14 = pbVar13;
          pcStack_2188 = (code *)0x12bc64;
          test_bson_iter_as_bool_cold_2();
LAB_0012bc64:
          pcStack_2188 = (code *)0x12bc69;
          test_bson_iter_as_bool_cold_5();
LAB_0012bc69:
          pbVar15 = pbVar14;
          pcStack_2188 = (code *)0x12bc6e;
          test_bson_iter_as_bool_cold_3();
        }
        else {
          pcStack_2188 = (code *)0x12bbd5;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bbdd;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          pbVar13 = &bStack_2180;
          if (cVar1 != '\0') goto LAB_0012bc5a;
          pcStack_2188 = (code *)0x12bbec;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bbf4;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          pbVar13 = &bStack_2180;
          if (cVar1 == '\0') goto LAB_0012bc5f;
          pcStack_2188 = (code *)0x12bc03;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bc0b;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          if (cVar1 != '\0') goto LAB_0012bc64;
          pcStack_2188 = (code *)0x12bc1a;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bc22;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          pbVar14 = &bStack_2180;
          if (cVar1 == '\0') goto LAB_0012bc69;
          pcStack_2188 = (code *)0x12bc31;
          bson_iter_next(&bStack_2180);
          pcStack_2188 = (code *)0x12bc39;
          cVar1 = bson_iter_as_bool(&bStack_2180);
          if (cVar1 == '\0') {
            pcStack_2188 = (code *)0x12bc4a;
            bson_destroy(abStack_2100);
            return;
          }
        }
        pcStack_2188 = test_bson_iter_binary_deprecated;
        test_bson_iter_as_bool_cold_4();
        pcStack_2308 = (code *)0x12bc91;
        pbStack_2198 = pbVar15;
        puStack_2190 = (undefined1 *)&bStack_2180;
        pcStack_2188 = (code *)&pcStack_1f88;
        pbVar6 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                         );
        if (pbVar6 == (bson_t *)0x0) {
          pcStack_2308 = (code *)0x12bd06;
          test_bson_iter_binary_deprecated_cold_5();
LAB_0012bd06:
          pcStack_2308 = (code *)0x12bd0b;
          test_bson_iter_binary_deprecated_cold_1();
LAB_0012bd0b:
          pcStack_2308 = (code *)0x12bd10;
          test_bson_iter_binary_deprecated_cold_2();
LAB_0012bd10:
          pcStack_2308 = (code *)0x12bd15;
          test_bson_iter_binary_deprecated_cold_3();
        }
        else {
          pcStack_2308 = (code *)0x12bca9;
          cVar1 = bson_iter_init(auStack_2280,pbVar6);
          pbVar15 = pbVar6;
          if (cVar1 == '\0') goto LAB_0012bd06;
          pcStack_2308 = (code *)0x12bcba;
          cVar1 = bson_iter_next(auStack_2280);
          if (cVar1 == '\0') goto LAB_0012bd0b;
          pbVar8 = (bson_t *)&iStack_2288;
          pcStack_2308 = (code *)0x12bcdd;
          bson_iter_binary(auStack_2280,auStack_2284,pbVar8,&piStack_2290);
          if (iStack_2288 != 4) goto LAB_0012bd10;
          if (*piStack_2290 == 0x34333231) {
            pcStack_2308 = (code *)0x12bcf8;
            bson_destroy(pbVar6);
            return;
          }
        }
        pcStack_2308 = test_bson_iter_from_data;
        test_bson_iter_binary_deprecated_cold_4();
        uStack_2410 = 0x100620800000009;
        uStack_2408 = 0;
        suite = aTStack_2400;
        pcStack_2488 = (code *)0x12bd51;
        pcStack_2308 = (code *)&pcStack_2188;
        cVar1 = bson_iter_init_from_data(suite,&uStack_2410,9);
        if (cVar1 == '\0') {
          pcStack_2488 = (code *)0x12bd93;
          test_bson_iter_from_data_cold_1();
LAB_0012bd93:
          pcStack_2488 = (code *)0x12bd98;
          test_bson_iter_from_data_cold_2();
LAB_0012bd98:
          pcStack_2488 = (code *)0x12bd9d;
          test_bson_iter_from_data_cold_3();
        }
        else {
          suite = aTStack_2400;
          pcStack_2488 = (code *)0x12bd62;
          cVar1 = bson_iter_next();
          if (cVar1 == '\0') goto LAB_0012bd93;
          suite = aTStack_2400;
          pcStack_2488 = (code *)0x12bd73;
          iVar2 = bson_iter_type();
          if (iVar2 != 8) goto LAB_0012bd98;
          suite = aTStack_2400;
          pcStack_2488 = (code *)0x12bd85;
          cVar1 = bson_iter_bool();
          if (cVar1 != '\0') {
            return;
          }
        }
        pcStack_2488 = get_bson;
        test_bson_iter_from_data_cold_4();
        pbStack_2490 = pbVar15;
        pcStack_2488 = (code *)pbVar8;
        iVar2 = open((char *)suite,0);
        if (iVar2 != -1) {
          uVar18 = read(iVar2,auStack_3498,0x1000);
          if ((long)uVar18 < 0) goto LAB_0012be04;
          if (uVar18 != 0) {
            bson_new_from_data(auStack_3498,uVar18 & 0xffffffff);
            close(iVar2);
            return;
          }
          get_bson_cold_1();
        }
        get_bson_cold_3();
LAB_0012be04:
        get_bson_cold_2();
        TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
        TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
        TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
        TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
        TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
        TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
        TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
        TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
        TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
        TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
        TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
        TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
        TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                      test_bson_as_canonical_extended_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
        TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
        TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
        TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
        TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
        TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
        TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
        TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
        TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
        TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
        TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
        TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
        TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
        TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
        TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
        TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
        TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
        TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
        TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
        TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
        TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
        TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
        TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
        TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
        TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
        TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
        TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
        TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
        TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
        TestSuite_Add(suite,"/bson/json/read/regex_options_order",
                      test_bson_json_read_regex_options_order);
        TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
        TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
        TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
        TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
        TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
        TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
        TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
        TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
        TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
        TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
        TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
        TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
        TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
        TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
        TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
        TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
        TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
        TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
        TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
        TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
        TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
        TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
        TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
        TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
        TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
        TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
        return;
      }
LAB_0012abef:
      apcStack_888[0] = (code *)0x12abf7;
      cVar1 = bson_iter_next(auStack_800);
      if (cVar1 != '\0') {
        if (uStack_7d8 < 0x200) {
          apcStack_888[0] = (code *)0x12ac18;
          uVar3 = bson_iter_type(auStack_800);
          if (uVar3 < 0x14) break;
          goto LAB_0012acc1;
        }
        apcStack_888[0] = (code *)0x12ad0b;
        test_bson_iter_fuzz_cold_2();
        goto LAB_0012ad0b;
      }
      apcStack_888[0] = (code *)0x12acdf;
      bson_destroy(lVar7);
    }
    apcStack_888[0] = (code *)0x12ace7;
    bson_free(puVar9);
    uVar3 = (int)puVar17 + 1;
    puVar17 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 100000) {
      return;
    }
  } while( true );
  if ((0xfff66U >> (uVar3 & 0x1f) & 1) == 0) {
    if ((0x18U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 7) {
        if (uStack_7f8 <= iStack_7f4 + 0xcU) goto LAB_0012ad29;
      }
      else {
LAB_0012acc1:
        if ((uVar3 != 0x7f) && (uVar3 != 0xff)) goto LAB_0012ad2e;
      }
    }
    else {
      puStack_808 = (uint *)0x0;
      uStack_80c = 0;
      apcStack_888[0] = (code *)0x12ac54;
      bson_iter_document(auStack_800,&uStack_80c,&puStack_808);
      if (uStack_80c != 0) {
        if (puStack_808 == (uint *)0x0) goto LAB_0012ad10;
        if (uStack_80c < 5) goto LAB_0012ad15;
        if (*(uint *)(lVar7 + 4) <= iStack_7f4 + uStack_80c) goto LAB_0012ad1a;
        if (uStack_80c == 0xffffffff) goto LAB_0012ad1f;
        uStack_80c = *puStack_808;
        if (uStack_80c < 5) goto LAB_0012ad24;
      }
    }
  }
  goto LAB_0012abef;
}

Assistant:

static void
test_bson_iter_utf8 (void)
{
   uint32_t len = 0;
   bson_iter_t iter;
   bson_t *b;
   char *s;

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "foo", -1, "bar", -1));
   BSON_ASSERT (bson_append_utf8 (b, "bar", -1, "baz", -1));
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   BSON_ASSERT (BSON_ITER_HOLDS_UTF8 (&iter));
   BSON_ASSERT (!strcmp (bson_iter_key (&iter), "foo"));
   BSON_ASSERT (!strcmp (bson_iter_utf8 (&iter, NULL), "bar"));
   s = bson_iter_dup_utf8 (&iter, &len);
   BSON_ASSERT_CMPSTR ("bar", s);
   BSON_ASSERT_CMPINT (len, ==, 3);
   bson_free (s);
   BSON_ASSERT (bson_iter_next (&iter));
   BSON_ASSERT (BSON_ITER_HOLDS_UTF8 (&iter));
   BSON_ASSERT (!strcmp (bson_iter_key (&iter), "bar"));
   BSON_ASSERT (!strcmp (bson_iter_utf8 (&iter, NULL), "baz"));
   BSON_ASSERT (!bson_iter_next (&iter));
   bson_destroy (b);
}